

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffkeyn(char *keyroot,int value,char *keyname,int *status)

{
  size_t sVar1;
  size_t sVar2;
  int *in_RCX;
  char *in_RDX;
  uint in_ESI;
  char *in_RDI;
  bool bVar3;
  size_t rootlen;
  char suffix [16];
  size_t local_40;
  char local_38 [16];
  int *local_28;
  char *local_20;
  uint local_14;
  char *local_10;
  int local_4;
  
  *in_RDX = '\0';
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = strlen(in_RDI);
  if ((local_40 == 0) || ((int)local_14 < 0)) {
    *local_28 = 0xce;
    local_4 = 0xce;
  }
  else {
    snprintf(local_38,0x10,"%d",(ulong)local_14);
    strcpy(local_20,local_10);
    while( true ) {
      bVar3 = false;
      if (local_40 != 0) {
        bVar3 = local_20[local_40 - 1] == ' ';
      }
      if (!bVar3) break;
      local_40 = local_40 - 1;
      local_20[local_40] = '\0';
    }
    sVar1 = strlen(local_38);
    sVar2 = strlen(local_20);
    if (sVar1 + sVar2 < 9) {
      strcat(local_20,local_38);
      local_4 = *local_28;
    }
    else {
      *local_28 = 0xce;
      local_4 = 0xce;
    }
  }
  return local_4;
}

Assistant:

int ffkeyn(const char *keyroot,   /* I - root string for keyword name */
           int value,       /* I - index number to be appended to root name */
           char *keyname,   /* O - output root + index keyword name */
           int *status)     /* IO - error status  */
/*
  Construct a keyword name string by appending the index number to the root.
  e.g., if root = "TTYPE" and value = 12 then keyname = "TTYPE12".
*/
{
    char suffix[16];
    size_t rootlen;

    keyname[0] = '\0';            /* initialize output name to null */
    rootlen = strlen(keyroot);

    if (rootlen == 0 || value < 0 )
       return(*status = 206);

    snprintf(suffix, 16, "%d", value); /* construct keyword suffix */

    strcpy(keyname, keyroot);   /* copy root string to name string */
    while (rootlen > 0 && keyname[rootlen - 1] == ' ') {
        rootlen--;                 /* remove trailing spaces in root name */
        keyname[rootlen] = '\0';
    }
    if (strlen(suffix) + strlen(keyname) > 8)
       return (*status=206);
       
    strcat(keyname, suffix);    /* append suffix to the root */
    return(*status);
}